

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O0

void runpobj(runcxdef *ctx,objnum obj)

{
  short in_SI;
  runsdef val;
  runcxdef *in_stack_ffffffffffffffe0;
  dattyp in_stack_ffffffffffffffec;
  undefined6 in_stack_fffffffffffffff0;
  
  if (in_SI == -1) {
    runpnil(in_stack_ffffffffffffffe0);
  }
  else {
    runpush((runcxdef *)CONCAT26(in_SI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec,
            (runsdef *)in_stack_ffffffffffffffe0);
  }
  return;
}

Assistant:

void runpobj(runcxdef *ctx, objnum obj)
{
    runsdef val;
    
    if (obj == MCMONINV)
        runpnil(ctx);
    else
    {
        val.runsv.runsvobj = obj;
        runpush(ctx, DAT_OBJECT, &val);
    }
}